

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearModel.cpp
# Opt level: O0

void __thiscall
CoreML::LinearModel::LinearModel(LinearModel *this,string *predictedValueOutput,string *description)

{
  element_type *this_00;
  ModelDescription *this_01;
  Arena *pAVar1;
  string *description_local;
  string *predictedValueOutput_local;
  LinearModel *this_local;
  
  Model::Model(&this->super_Model,description);
  (this->super_Model)._vptr_Model = (_func_int **)&PTR__LinearModel_006fb318;
  this_00 = std::
            __shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&(this->super_Model).m_spec);
  this_01 = Specification::Model::mutable_description(this_00);
  pAVar1 = google::protobuf::MessageLite::GetArenaForAllocation(&this_01->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::Set
            (&this_01->predictedfeaturename_,predictedValueOutput,pAVar1);
  return;
}

Assistant:

LinearModel::LinearModel(const std::string& predictedValueOutput,
                             const std::string& description)
    : Model(description) {
        m_spec->mutable_description()->set_predictedfeaturename(predictedValueOutput);
    }